

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::App::_validate(App *this)

{
  bool bVar1;
  InvalidError *pIVar2;
  element_type *peVar3;
  ulong uVar4;
  size_type sVar5;
  allocator local_f1;
  string local_f0;
  undefined1 local_ca;
  allocator local_c9;
  string local_c8;
  __shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_a8;
  App_p *app;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *__range1;
  size_t nameless_subs;
  string local_70;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *local_48;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *local_40;
  difference_type local_38;
  difference_type pcount_req;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *local_28;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *local_20;
  difference_type local_18;
  difference_type pcount;
  App *this_local;
  
  pcount = (difference_type)this;
  local_20 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
             ::std::
             begin<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                       (&this->options_);
  local_28 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
             ::std::
             end<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                       (&this->options_);
  local_18 = ::std::
             count_if<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,CLI::App::_validate()const::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_1_>
                       (local_20,local_28);
  if (1 < local_18) {
    local_40 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
               ::std::
               begin<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                         (&this->options_);
    local_48 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
               ::std::
               end<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                         (&this->options_);
    local_38 = ::std::
               count_if<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,CLI::App::_validate()const::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_2_>
                         (local_40,local_48);
    if (1 < local_18 - local_38) {
      pIVar2 = (InvalidError *)__cxa_allocate_exception(0x38);
      ::std::__cxx11::string::string((string *)&local_70,(string *)&this->name_);
      InvalidError::InvalidError(pIVar2,&local_70);
      __cxa_throw(pIVar2,&InvalidError::typeinfo,InvalidError::~InvalidError);
    }
  }
  __range1 = (vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *)0x0;
  __end1 = std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::
           begin(&this->subcommands_);
  app = (App_p *)std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                 ::end(&this->subcommands_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                                     *)&app), bVar1) {
    local_a8 = (__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               __gnu_cxx::
               __normal_iterator<const_std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
               ::operator*(&__end1);
    peVar3 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_a8);
    _validate(peVar3);
    peVar3 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_a8);
    get_name_abi_cxx11_(peVar3);
    uVar4 = ::std::__cxx11::string::empty();
    if ((uVar4 & 1) != 0) {
      __range1 = (vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *)
                 ((long)&(__range1->
                         super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + 1);
    }
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
    ::operator++(&__end1);
  }
  if (this->require_option_min_ != 0) {
    if ((this->require_option_max_ != 0) && (this->require_option_max_ < this->require_option_min_))
    {
      local_ca = 1;
      pIVar2 = (InvalidError *)__cxa_allocate_exception(0x38);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_c8,"Required min options greater than required max options",
                 &local_c9);
      InvalidError::InvalidError(pIVar2,&local_c8,InvalidError);
      local_ca = 0;
      __cxa_throw(pIVar2,&InvalidError::typeinfo,InvalidError::~InvalidError);
    }
    uVar4 = this->require_option_min_;
    sVar5 = std::
            vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
            ::size(&this->options_);
    if ((long)&(__range1->
               super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
               )._M_impl.super__Vector_impl_data._M_start + sVar5 < uVar4) {
      pIVar2 = (InvalidError *)__cxa_allocate_exception(0x38);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_f0,"Required min options greater than number of available options"
                 ,&local_f1);
      InvalidError::InvalidError(pIVar2,&local_f0,InvalidError);
      __cxa_throw(pIVar2,&InvalidError::typeinfo,InvalidError::~InvalidError);
    }
  }
  return;
}

Assistant:

CLI11_INLINE void App::_validate() const {
    // count the number of positional only args
    auto pcount = std::count_if(std::begin(options_), std::end(options_), [](const Option_p &opt) {
        return opt->get_items_expected_max() >= detail::expected_max_vector_size && !opt->nonpositional();
    });
    if(pcount > 1) {
        auto pcount_req = std::count_if(std::begin(options_), std::end(options_), [](const Option_p &opt) {
            return opt->get_items_expected_max() >= detail::expected_max_vector_size && !opt->nonpositional() &&
                   opt->get_required();
        });
        if(pcount - pcount_req > 1) {
            throw InvalidError(name_);
        }
    }

    std::size_t nameless_subs{0};
    for(const App_p &app : subcommands_) {
        app->_validate();
        if(app->get_name().empty())
            ++nameless_subs;
    }

    if(require_option_min_ > 0) {
        if(require_option_max_ > 0) {
            if(require_option_max_ < require_option_min_) {
                throw(InvalidError("Required min options greater than required max options", ExitCodes::InvalidError));
            }
        }
        if(require_option_min_ > (options_.size() + nameless_subs)) {
            throw(
                InvalidError("Required min options greater than number of available options", ExitCodes::InvalidError));
        }
    }
}